

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1710::run(TestCase1710 *this)

{
  byte *pbVar1;
  ArrayPtr<const_capnp::_::ListReader> lists_00;
  PointerType PVar2;
  long lVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Orphanage OVar7;
  Reader value;
  Reader value_00;
  Fault f;
  StructPointerCount local_2e4;
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  uint local_2b8;
  StructPointerCount local_2b4;
  bool local_2b0;
  ArrayPtr<const_char> local_2a8;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> cat;
  char *local_260;
  DebugExpression<bool> _kjCondition_7;
  undefined7 uStack_257;
  undefined4 uStack_254;
  Reader lists [2];
  OrphanBuilder local_1d0;
  OrphanBuilder local_1b0;
  OrphanBuilder local_190;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> list2;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  OVar7 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  OrphanBuilder::initStructList
            ((OrphanBuilder *)lists,OVar7.arena,OVar7.capTable,2,(StructSize)0x20001);
  local_1b0.segment = (SegmentBuilder *)lists[0].reader.capTable;
  local_1b0.capTable = (CapTableBuilder *)lists[0].reader.ptr;
  local_1b0.location = (word *)lists[0].reader._24_8_;
  OrphanBuilder::asStructList(&list1.builder,&local_1b0,(StructSize)0x20001);
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,0);
  lists[0].reader.ptr[0] = '\f';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,0);
  cat.reader.capTable = lists[0].reader.capTable;
  cat.reader.ptr = (byte *)lists[0].reader._24_8_;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&cat,value);
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,1);
  lists[0].reader.ptr[0] = '\"';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,1);
  cat.reader.capTable = lists[0].reader.capTable;
  cat.reader.ptr = (byte *)lists[0].reader._24_8_;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&cat,value_00);
  OrphanBuilder::initStruct((OrphanBuilder *)lists,OVar7.arena,OVar7.capTable,(StructSize)0x10000);
  local_1d0.segment = (SegmentBuilder *)lists[0].reader.capTable;
  local_1d0.capTable = (CapTableBuilder *)lists[0].reader.ptr;
  local_1d0.location = (word *)lists[0].reader._24_8_;
  OrphanBuilder::asStruct((StructBuilder *)lists,&local_1d0,(StructSize)0x10000);
  cat.reader.segment =
       (SegmentReader *)
       CONCAT44(lists[0].reader.segment._4_4_,(ListElementCount)lists[0].reader.segment);
  cat.reader.capTable = lists[0].reader.capTable;
  cat.reader.ptr = (byte *)lists[0].reader._24_8_;
  PointerBuilder::initList(&list2.builder,(PointerBuilder *)&cat,EIGHT_BYTES,2);
  lists[0].reader.segment._0_4_ = list2.builder.elementCount;
  lists[0].reader.capTable = (CapTableReader *)0x2;
  lists[0].reader.ptr = " == ";
  lists[0].reader.elementCount = 5;
  lists[0].reader.step = 0;
  lists[0].reader.structDataSize._0_1_ = list2.builder.elementCount == 2;
  if (!(bool)(undefined1)lists[0].reader.structDataSize) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
              ((Fault *)&cat,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x62c,FAILED,"builder.size() == values.size()","_kjCondition,",
               (DebugComparison<unsigned_int,_unsigned_long> *)lists);
    kj::_::Debug::Fault::fatal((Fault *)&cat);
  }
  list2.builder.ptr[0] = '9';
  list2.builder.ptr[1] = '0';
  list2.builder.ptr[2] = '\0';
  list2.builder.ptr[3] = '\0';
  list2.builder.ptr[4] = '\0';
  list2.builder.ptr[5] = '\0';
  list2.builder.ptr[6] = '\0';
  list2.builder.ptr[7] = '\0';
  pbVar1 = list2.builder.ptr + (list2.builder.step >> 3);
  builtin_memcpy(list2.builder.ptr + (list2.builder.step >> 3),"2\t\x01",4);
  pbVar1[4] = '\0';
  pbVar1[5] = '\0';
  pbVar1[6] = '\0';
  pbVar1[7] = '\0';
  OrphanBuilder::asListReader(&lists[0].reader,&local_1b0,INLINE_COMPOSITE);
  OrphanBuilder::asStructReader((StructReader *)&cat,&local_1d0,(StructSize)0x10000);
  bVar4 = cat.reader.structPointerCount == 0;
  _kjCondition_1.op.content.size_ = CONCAT44(cat.reader.step,cat.reader.elementCount);
  if (bVar4) {
    _kjCondition_1.op.content.size_ = 0;
  }
  _kjCondition_1._24_4_ = 0x7fffffff;
  if (!bVar4) {
    _kjCondition_1._24_4_ = cat.reader.nestingLimit;
  }
  _kjCondition_1.left = 0;
  _kjCondition_1.right = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    _kjCondition_1.left = (int)cat.reader.segment;
    _kjCondition_1.right = cat.reader.segment._4_4_;
    uVar5 = cat.reader.capTable._0_4_;
    uVar6 = cat.reader.capTable._4_4_;
  }
  _kjCondition_1.op.content.ptr = (char *)CONCAT44(uVar6,uVar5);
  PointerReader::getList
            (&lists[1].reader,(PointerReader *)&_kjCondition_1,INLINE_COMPOSITE,(word *)0x0);
  OVar7 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  _kjCondition_1.op.content.ptr = (char *)0x2;
  lists_00.size_ = 2;
  lists_00.ptr = &lists[0].reader;
  _kjCondition_1._0_8_ = &lists[0].reader;
  OrphanBuilder::concat
            ((OrphanBuilder *)&cat,OVar7.arena,OVar7.capTable,INLINE_COMPOSITE,(StructSize)0x20001,
             lists_00);
  local_190.segment = (SegmentBuilder *)cat.reader.capTable;
  local_190.capTable = (CapTableBuilder *)cat.reader.ptr;
  local_190.tag.content = (uint64_t)cat.reader.segment;
  OrphanBuilder::asListReader(&cat.reader,&local_190,INLINE_COMPOSITE);
  _kjCondition_1.right = cat.reader.elementCount;
  _kjCondition_1.left = 4;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = cat.reader.elementCount == 4;
  if (cat.reader.elementCount != 4) {
    __kjCondition_7 = (SegmentReader *)CONCAT44(uStack_254,4);
    local_2a8.ptr._0_4_ = cat.reader.elementCount;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6c7,FAILED,"(4) == (cat.size())","_kjCondition,4, cat.size()",&_kjCondition_1,
               (int *)&_kjCondition_7,(uint *)&local_2a8);
    kj::_::Debug::Fault::fatal(&f);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,0);
  if (local_2b8 < 0x40) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)_kjCondition_1.op.content.size_;
  }
  f.exception._0_4_ = 0xc;
  if ((lVar3 != 0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8.ptr._0_4_ = 0xc;
    ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,0);
    if (local_2b8 < 0x40) {
      __kjCondition_7 = (SegmentReader *)0x0;
    }
    else {
      __kjCondition_7 = *(SegmentReader **)_kjCondition_1.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6c9,ERROR,
               "\"failed: expected \" \"(12) == (cat[0].getOld1())\", _kjCondition, 12, cat[0].getOld1()"
               ,(char (*) [44])"failed: expected (12) == (cat[0].getOld1())",
               (DebugComparison<int,_long> *)&f,(int *)&local_2a8,(long *)&_kjCondition_7);
  }
  local_260 = "foo";
  ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
  uVar5 = 0;
  uVar6 = 0;
  if (local_2e4 != 0) {
    uVar5 = f.exception._0_4_;
    uVar6 = f.exception._4_4_;
  }
  __kjCondition_7 = (SegmentReader *)CONCAT44(uVar6,uVar5);
  local_2a8 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_7,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[4]> *)&local_260,(Reader *)&local_2a8);
  if ((local_2b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
    uVar5 = 0;
    uVar6 = 0;
    if (local_2e4 != 0) {
      uVar5 = f.exception._0_4_;
      uVar6 = f.exception._4_4_;
    }
    __kjCondition_7 = (SegmentReader *)CONCAT44(uVar6,uVar5);
    local_2a8 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_7,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[47],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6ca,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", _kjCondition, \"foo\", cat[0].getOld2()"
               ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
               (char (*) [4])"foo",(Reader *)&local_2a8);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,1);
  if (local_2b8 < 0x40) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)_kjCondition_1.op.content.size_;
  }
  f.exception._0_4_ = 0x22;
  if ((lVar3 != 0x22) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8.ptr._0_4_ = 0x22;
    ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,1);
    if (local_2b8 < 0x40) {
      __kjCondition_7 = (SegmentReader *)0x0;
    }
    else {
      __kjCondition_7 = *(SegmentReader **)_kjCondition_1.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6cc,ERROR,
               "\"failed: expected \" \"(34) == (cat[1].getOld1())\", _kjCondition, 34, cat[1].getOld1()"
               ,(char (*) [44])"failed: expected (34) == (cat[1].getOld1())",
               (DebugComparison<int,_long> *)&f,(int *)&local_2a8,(long *)&_kjCondition_7);
  }
  local_260 = "bar";
  ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
  uVar5 = 0;
  uVar6 = 0;
  if (local_2e4 != 0) {
    uVar5 = f.exception._0_4_;
    uVar6 = f.exception._4_4_;
  }
  __kjCondition_7 = (SegmentReader *)CONCAT44(uVar6,uVar5);
  local_2a8 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_7,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[4]> *)&local_260,(Reader *)&local_2a8);
  if ((local_2b0 == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
    uVar5 = 0;
    uVar6 = 0;
    if (local_2e4 != 0) {
      uVar5 = f.exception._0_4_;
      uVar6 = f.exception._4_4_;
    }
    __kjCondition_7 = (SegmentReader *)CONCAT44(uVar6,uVar5);
    local_2a8 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_7,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[47],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6cd,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", _kjCondition, \"bar\", cat[1].getOld2()"
               ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
               (char (*) [4])0x28e857,(Reader *)&local_2a8);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,2);
  if (local_2b8 < 0x40) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)_kjCondition_1.op.content.size_;
  }
  f.exception._0_4_ = 0x3039;
  if ((lVar3 != 0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8.ptr._0_4_ = 0x3039;
    ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,2);
    if (local_2b8 < 0x40) {
      __kjCondition_7 = (SegmentReader *)0x0;
    }
    else {
      __kjCondition_7 = *(SegmentReader **)_kjCondition_1.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6cf,ERROR,
               "\"failed: expected \" \"(12345) == (cat[2].getOld1())\", _kjCondition, 12345, cat[2].getOld1()"
               ,(char (*) [47])"failed: expected (12345) == (cat[2].getOld1())",
               (DebugComparison<int,_long> *)&f,(int *)&local_2a8,(long *)&_kjCondition_7);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,2);
  if (local_2b4 == 0) {
    f.exception = (Exception *)0x0;
  }
  else {
    f.exception = (Exception *)_kjCondition_1._0_8_;
  }
  PVar2 = PointerReader::getPointerType((PointerReader *)&f);
  __kjCondition_7 = (SegmentReader *)CONCAT71(uStack_257,PVar2 == NULL_);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6d0,ERROR,"\"failed: expected \" \"!(cat[2].hasOld2())\", _kjCondition",
               (char (*) [37])"failed: expected !(cat[2].hasOld2())",&_kjCondition_7);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,3);
  if (local_2b8 < 0x40) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)_kjCondition_1.op.content.size_;
  }
  f.exception._0_4_ = 0x10932;
  if ((lVar3 != 0x10932) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8.ptr._0_4_ = 0x10932;
    ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,3);
    if (local_2b8 < 0x40) {
      __kjCondition_7 = (SegmentReader *)0x0;
    }
    else {
      __kjCondition_7 = *(SegmentReader **)_kjCondition_1.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6d2,ERROR,
               "\"failed: expected \" \"(67890) == (cat[3].getOld1())\", _kjCondition, 67890, cat[3].getOld1()"
               ,(char (*) [47])"failed: expected (67890) == (cat[3].getOld1())",
               (DebugComparison<int,_long> *)&f,(int *)&local_2a8,(long *)&_kjCondition_7);
  }
  ListReader::getStructElement((StructReader *)&_kjCondition_1,&cat.reader,3);
  if (local_2b4 == 0) {
    f.exception = (Exception *)0x0;
  }
  else {
    f.exception = (Exception *)_kjCondition_1._0_8_;
  }
  PVar2 = PointerReader::getPointerType((PointerReader *)&f);
  __kjCondition_7 = (SegmentReader *)CONCAT71(uStack_257,PVar2 == NULL_);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6d3,ERROR,"\"failed: expected \" \"!(cat[3].hasOld2())\", _kjCondition",
               (char (*) [37])"failed: expected !(cat[3].hasOld2())",&_kjCondition_7);
  }
  if (local_190.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_190);
  }
  if (local_1d0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1d0);
  }
  if (local_1b0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1b0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ConcatenateStructListsUpgradeFromPrimitive) {
  // Like above, but we're "upgrading" a primitive list to a struct list.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<uint64_t>>(2);
  initList(list2, {12345, 67890});

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = message.getOrphanage().newOrphanConcat(array);
  auto cat = orphan3.getReader();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());

  EXPECT_EQ(12345, cat[2].getOld1());
  EXPECT_FALSE(cat[2].hasOld2());

  EXPECT_EQ(67890, cat[3].getOld1());
  EXPECT_FALSE(cat[3].hasOld2());
}